

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

void player_spells_init(player *p)

{
  int iVar1;
  uint8_t *puVar2;
  int local_14;
  wchar_t num_spells;
  wchar_t i;
  player *p_local;
  
  iVar1 = (p->class->magic).total_spells;
  if (iVar1 != 0) {
    puVar2 = (uint8_t *)mem_zalloc((long)iVar1);
    p->spell_flags = puVar2;
    puVar2 = (uint8_t *)mem_zalloc((long)iVar1);
    p->spell_order = puVar2;
    for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
      p->spell_order[local_14] = 'c';
    }
  }
  return;
}

Assistant:

void player_spells_init(struct player *p)
{
	int i, num_spells = p->class->magic.total_spells;

	/* None */
	if (!num_spells) return;

	/* Allocate */
	p->spell_flags = mem_zalloc(num_spells * sizeof(uint8_t));
	p->spell_order = mem_zalloc(num_spells * sizeof(uint8_t));

	/* None of the spells have been learned yet */
	for (i = 0; i < num_spells; i++)
		p->spell_order[i] = 99;
}